

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

U32 ZSTD_downscaleStat(uint *table,U32 lastEltIndex,int malus)

{
  U32 UVar1;
  ulong uVar2;
  uint uVar3;
  
  UVar1 = 0;
  for (uVar2 = 0; lastEltIndex + 1 != uVar2; uVar2 = uVar2 + 1) {
    uVar3 = table[uVar2] >> ((char)malus + 4U & 0x1f);
    table[uVar2] = uVar3 + 1;
    UVar1 = UVar1 + uVar3 + 1;
  }
  return UVar1;
}

Assistant:

static U32 ZSTD_downscaleStat(unsigned* table, U32 lastEltIndex, int malus)
{
    U32 s, sum=0;
    DEBUGLOG(5, "ZSTD_downscaleStat (nbElts=%u)", (unsigned)lastEltIndex+1);
    assert(ZSTD_FREQ_DIV+malus > 0 && ZSTD_FREQ_DIV+malus < 31);
    for (s=0; s<lastEltIndex+1; s++) {
        table[s] = 1 + (table[s] >> (ZSTD_FREQ_DIV+malus));
        sum += table[s];
    }
    return sum;
}